

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,char *error)

{
  uint64 uVar1;
  bool bVar2;
  Token *pTVar3;
  double dVar4;
  undefined1 auVar5 [16];
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  uint64 local_30;
  uint64 value;
  char *error_local;
  double *output_local;
  Parser *this_local;
  
  value = (uint64)error;
  error_local = (char *)output;
  output_local = (double *)this;
  bVar2 = LookingAtType(this,TYPE_FLOAT);
  if (bVar2) {
    pTVar3 = io::Tokenizer::current(this->input_);
    dVar4 = io::Tokenizer::ParseFloat(&pTVar3->text);
    *(double *)error_local = dVar4;
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    bVar2 = LookingAtType(this,TYPE_INTEGER);
    if (bVar2) {
      local_30 = 0;
      pTVar3 = io::Tokenizer::current(this->input_);
      bVar2 = io::Tokenizer::ParseInteger(&pTVar3->text,0xffffffffffffffff,&local_30);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_50,"Integer out of range.",&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
      auVar5._8_4_ = (int)(local_30 >> 0x20);
      auVar5._0_8_ = local_30;
      auVar5._12_4_ = 0x45300000;
      *(double *)error_local =
           (auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0);
      io::Tokenizer::Next(this->input_);
      this_local._7_1_ = true;
    }
    else {
      bVar2 = LookingAt(this,"inf");
      if (bVar2) {
        dVar4 = std::numeric_limits<double>::infinity();
        *(double *)error_local = dVar4;
        io::Tokenizer::Next(this->input_);
        this_local._7_1_ = true;
      }
      else {
        bVar2 = LookingAt(this,"nan");
        uVar1 = value;
        if (bVar2) {
          dVar4 = std::numeric_limits<double>::quiet_NaN();
          *(double *)error_local = dVar4;
          io::Tokenizer::Next(this->input_);
          this_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_88,(char *)uVar1,&local_89);
          AddError(this,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator((allocator<char> *)&local_89);
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeNumber(double* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     kuint64max, &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    *output = value;
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}